

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall application::Chat::Chat(Chat *this)

{
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  std::__cxx11::wstring::wstring((wstring *)this,L"Unknown user",&local_19);
  std::__cxx11::wstring::wstring((wstring *)&this->separator_,L": ",&local_1a);
  std::__cxx11::wstring::wstring
            ((wstring *)&this->prompt_,L"---------------\nEnter you message: ",&local_1b);
  (this->input_)._M_dataplus._M_p = (pointer)&(this->input_).field_2;
  (this->input_)._M_string_length = 0;
  (this->input_).field_2._M_local_buf[0] = L'\0';
  *(undefined8 *)&(this->sendMessageCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendMessageCallback_).super__Function_base._M_functor + 8) = 0;
  (this->sendMessageCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendMessageCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->beforeExiting_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->beforeExiting_).super__Function_base._M_functor + 8) = 0;
  (this->beforeExiting_)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/application/application.cpp:110:116)>
       ::_M_invoke;
  (this->beforeExiting_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/application/application.cpp:110:116)>
       ::_M_manager;
  (this->mut).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  calcPrompt(this);
  return;
}

Assistant:

Chat::Chat()
	: username_(L"Unknown user"), separator_(L": "), prompt_(L"---------------\nEnter you message: "), beforeExiting_([]() {})
{
	calcPrompt();
}